

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O3

PyObject * cpsm_ctrlp_match(PyObject *self,PyObject *args,PyObject *kwargs)

{
  PyObjPtr PVar1;
  _Alloc_hider this;
  pointer pbVar2;
  int iVar3;
  uint uVar4;
  CtrlPMatchMode CVar5;
  Options *pOVar6;
  _Head_base<0UL,__object_*,_false> _Var7;
  tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter> tVar8;
  Error *this_00;
  uint uVar9;
  pointer __p_1;
  PyObject *pPVar10;
  uint nr_threads;
  PyObject **ppPVar11;
  pointer pbVar12;
  pointer __p;
  string_ref str;
  string_ref mmode;
  string_ref query_00;
  undefined1 auVar13 [16];
  PyObjPtr matches_list;
  int is_path;
  int limit_int;
  PyObjPtr regex_str;
  PyObjPtr output_tuple;
  int unicode;
  int max_threads_int;
  int match_crfile;
  Py_ssize_t highlight_mode_size;
  char *highlight_mode_data;
  Py_ssize_t crfile_size;
  char *crfile_data;
  Py_ssize_t mmode_size;
  char *mmode_data;
  string query;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  highlight_regexes;
  PyObjPtr regexes_list;
  undefined4 local_c0;
  Py_ssize_t query_inverting_delimiter_size;
  char *query_inverting_delimiter_data;
  Py_ssize_t query_size;
  char *query_data;
  PyObject *items_obj;
  string_ref highlight_mode;
  Options mopts;
  Py_ssize_t regex_line_prefix_size;
  char *regex_line_prefix_data;
  
  limit_int = -1;
  mmode_data = (char *)0x0;
  mmode_size = 0;
  is_path = 0;
  crfile_data = (char *)0x0;
  crfile_size = 0;
  highlight_mode_data = (char *)0x0;
  highlight_mode_size = 0;
  match_crfile = 0;
  max_threads_int = 0;
  query_inverting_delimiter_data = (char *)0x0;
  query_inverting_delimiter_size = 0;
  regex_line_prefix_data = (char *)0x0;
  regex_line_prefix_size = 0;
  unicode = 0;
  ppPVar11 = &items_obj;
  iVar3 = _PyArg_ParseTupleAndKeywords_SizeT
                    (args,kwargs,"Os#|iz#iz#z#iiz#z#i",cpsm_ctrlp_match::kwlist,ppPVar11,&query_data
                     ,&query_size,&limit_int,&mmode_data,&mmode_size,&is_path,&crfile_data,
                     &crfile_size,&highlight_mode_data,&highlight_mode_size,&match_crfile,
                     &max_threads_int,&query_inverting_delimiter_data,
                     &query_inverting_delimiter_size,&regex_line_prefix_data,&regex_line_prefix_size
                     ,&unicode);
  if (iVar3 == 0) {
    return (PyObject *)0x0;
  }
  query._M_dataplus._M_p = (pointer)&query.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&query,query_data,query_data + query_size);
  if (query_inverting_delimiter_size != 0) {
    if (query_inverting_delimiter_size != 1) {
      this_00 = (Error *)__cxa_allocate_exception(0x28);
      cpsm::Error::Error<char_const*>
                (this_00,"query inverting delimiter must be a single character");
      __cxa_throw(this_00,&cpsm::Error::typeinfo,cpsm::Error::~Error);
    }
    str.len_._0_4_ = (int)*query_inverting_delimiter_data;
    str.ptr_ = (char *)query._M_string_length;
    str.len_._4_4_ = 0;
    cpsm::str_split((vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>
                     *)&regexes_list,(cpsm *)query._M_dataplus._M_p,str,(char)ppPVar11);
    highlight_regexes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._4_4_ =
         regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
         _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
         super__Head_base<0UL,__object_*,_false>._M_head_impl._4_4_;
    highlight_regexes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start._0_4_ = local_c0;
    highlight_regexes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_4_ =
         regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
         _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
         super__Head_base<0UL,__object_*,_false>._M_head_impl._0_4_;
    highlight_regexes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._4_4_ =
         regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
         _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
         super__Head_base<0UL,__object_*,_false>._M_head_impl._4_4_;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = ppPVar11;
    cpsm::
    str_join<boost::range_detail::reversed_range<std::vector<boost::basic_string_ref<char,std::char_traits<char>>,std::allocator<boost::basic_string_ref<char,std::char_traits<char>>>>const>>
              ((string *)&mopts,(cpsm *)&highlight_regexes,
               (reversed_range<const_std::vector<boost::basic_string_ref<char,_std::char_traits<char>_>,_std::allocator<boost::basic_string_ref<char,_std::char_traits<char>_>_>_>_>
                *)0x13f346,(string_ref)(auVar13 << 0x40));
    std::__cxx11::string::operator=((string *)&query,(string *)&mopts);
    if ((size_t *)mopts.crfile_.ptr_ != &mopts.limit_) {
      operator_delete(mopts.crfile_.ptr_);
    }
    if ((__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)
        regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
        _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
        super__Head_base<0UL,__object_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0) {
      operator_delete((void *)regexes_list._M_t.
                              super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>
                              ._M_t.
                              super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                              .super__Head_base<0UL,__object_*,_false>._M_head_impl);
    }
  }
  iVar3 = max_threads_int;
  regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
  super__Head_base<0UL,__object_*,_false>._M_head_impl =
       (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
       (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)crfile_data;
  nr_threads = 0;
  if (0 < max_threads_int) {
    nr_threads = max_threads_int;
  }
  uVar4 = std::thread::hardware_concurrency();
  uVar9 = uVar4 + (uVar4 == 0);
  if (uVar4 <= nr_threads) {
    nr_threads = uVar9;
  }
  if (iVar3 < 1) {
    nr_threads = uVar9;
  }
  pOVar6 = cpsm::Options::set_nr_threads((Options *)&regexes_list,nr_threads);
  pOVar6->path_ = is_path != 0;
  pOVar6->unicode_ = unicode != 0;
  pOVar6->want_match_info_ = true;
  mopts.crfile_.ptr_ = (pOVar6->crfile_).ptr_;
  mopts.crfile_.len_ = (pOVar6->crfile_).len_;
  mopts.limit_._0_4_ = (undefined4)pOVar6->limit_;
  mopts.limit_._4_4_ = *(undefined4 *)((long)&pOVar6->limit_ + 4);
  mopts.match_crfile_ = pOVar6->match_crfile_;
  mopts._25_3_ = *(undefined3 *)&pOVar6->field_0x19;
  mopts.nr_threads_ = pOVar6->nr_threads_;
  mopts.path_ = pOVar6->path_;
  mopts.unicode_ = pOVar6->unicode_;
  mopts.want_match_info_ = pOVar6->want_match_info_;
  mopts._35_5_ = *(undefined5 *)&pOVar6->field_0x23;
  highlight_mode.ptr_ = highlight_mode_data;
  highlight_mode.len_ = highlight_mode_size;
  _Var7._M_head_impl = (_object *)PyTuple_New(2);
  output_tuple._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
  super__Head_base<0UL,__object_*,_false>._M_head_impl =
       (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
       (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
       _Var7._M_head_impl;
  if ((tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter>)_Var7._M_head_impl ==
      (_Head_base<0UL,__object_*,_false>)0x0) {
    pPVar10 = (PyObject *)0x0;
    goto LAB_0010e5e9;
  }
  auVar13 = PyList_New(0);
  this = query._M_dataplus;
  mmode.len_ = auVar13._8_8_;
  matches_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
  super__Head_base<0UL,__object_*,_false>._M_head_impl = auVar13._0_8_;
  if ((tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter>)
      matches_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
      super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
      super__Head_base<0UL,__object_*,_false>._M_head_impl == (_Head_base<0UL,__object_*,_false>)0x0
     ) {
    _Var7._M_head_impl = (PyObject *)0x0;
    matches_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
    super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
    super__Head_base<0UL,__object_*,_false>._M_head_impl =
         (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
         (__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0;
  }
  else {
    highlight_regexes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    highlight_regexes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    highlight_regexes.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    mmode.ptr_ = (char *)mmode_size;
    CVar5 = cpsm::parse_ctrlp_match_mode((cpsm *)mmode_data,mmode);
    query_00.len_ = (size_t)&mopts;
    query_00.ptr_ = (char *)query._M_string_length;
    regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
    super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
    super__Head_base<0UL,__object_*,_false>._M_head_impl =
         (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
         (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)&matches_list
    ;
    (anonymous_namespace)::for_each_pyctrlp_match<cpsm_ctrlp_match(_object*,_object*,_object*)::__0>
              ((_anonymous_namespace_ *)this._M_p,query_00,(Options *)(ulong)CVar5,
               (CtrlPMatchMode)items_obj,(PyObject *)&regexes_list,
               (anon_class_40_5_0524c28d *)
               matches_list._M_t.
               super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
               super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
               super__Head_base<0UL,__object_*,_false>._M_head_impl);
    PVar1 = matches_list;
    matches_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
    super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
    super__Head_base<0UL,__object_*,_false>._M_head_impl =
         (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
         (__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0;
    iVar3 = PyTuple_SetItem(_Var7._M_head_impl,0,
                            PVar1._M_t.
                            super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
                            _M_t.
                            super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                            .super__Head_base<0UL,__object_*,_false>._M_head_impl);
    if (iVar3 == 0) {
      tVar8.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
      super__Head_base<0UL,__object_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>)PyList_New(0);
      regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
      super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
      super__Head_base<0UL,__object_*,_false>._M_head_impl =
           (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
           (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
           tVar8.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
           super__Head_base<0UL,__object_*,_false>._M_head_impl;
      if (tVar8.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
          super__Head_base<0UL,__object_*,_false>._M_head_impl ==
          (_Head_base<0UL,__object_*,_false>)0x0) {
LAB_0010e5c5:
        _Var7._M_head_impl = (PyObject *)0x0;
      }
      else {
        pbVar2 = highlight_regexes.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (highlight_regexes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            highlight_regexes.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pbVar12 = highlight_regexes.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          do {
            regex_str._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
            _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
            super__Head_base<0UL,__object_*,_false>._M_head_impl =
                 (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
                 PyUnicode_FromStringAndSize((pbVar12->_M_dataplus)._M_p,pbVar12->_M_string_length);
            if ((tuple<_object_*,_(anonymous_namespace)::PyObjectDeleter>)
                regex_str._M_t.
                super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>._M_t.
                super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
                super__Head_base<0UL,__object_*,_false>._M_head_impl ==
                (_Head_base<0UL,__object_*,_false>)0x0) {
              std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                        (&regex_str);
              goto LAB_0010e5c5;
            }
            iVar3 = PyList_Append(tVar8.
                                  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                                  .super__Head_base<0UL,__object_*,_false>._M_head_impl,
                                  regex_str._M_t.
                                  super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                                  .super__Head_base<0UL,__object_*,_false>._M_head_impl);
            std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr
                      (&regex_str);
            if (iVar3 < 0) goto LAB_0010e5c5;
            pbVar12 = pbVar12 + 1;
          } while (pbVar12 != pbVar2);
        }
        regexes_list._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
        _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
        super__Head_base<0UL,__object_*,_false>._M_head_impl =
             (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
             (__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0;
        iVar3 = PyTuple_SetItem(_Var7._M_head_impl,1,
                                tVar8.
                                super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>
                                .super__Head_base<0UL,__object_*,_false>._M_head_impl);
        if (iVar3 != 0) goto LAB_0010e5c5;
        output_tuple._M_t.super___uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>.
        _M_t.super__Tuple_impl<0UL,__object_*,_(anonymous_namespace)::PyObjectDeleter>.
        super__Head_base<0UL,__object_*,_false>._M_head_impl =
             (__uniq_ptr_data<_object,_(anonymous_namespace)::PyObjectDeleter,_true,_true>)
             (__uniq_ptr_impl<_object,_(anonymous_namespace)::PyObjectDeleter>)0x0;
      }
      std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr(&regexes_list);
    }
    else {
      _Var7._M_head_impl = (PyObject *)0x0;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&highlight_regexes);
  }
  std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr(&matches_list);
  pPVar10 = _Var7._M_head_impl;
LAB_0010e5e9:
  std::unique_ptr<_object,_(anonymous_namespace)::PyObjectDeleter>::~unique_ptr(&output_tuple);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)query._M_dataplus._M_p != &query.field_2) {
    operator_delete(query._M_dataplus._M_p);
  }
  return pPVar10;
}

Assistant:

static PyObject* cpsm_ctrlp_match(PyObject* self, PyObject* args,
                                  PyObject* kwargs) {
  static char const* kwlist[] = {"items", "query", "limit", "mmode", "ispath",
                                 "crfile", "highlight_mode", "match_crfile",
                                 "max_threads", "query_inverting_delimiter",
                                 "regex_line_prefix", "unicode", nullptr};
  // Required parameters.
  PyObject* items_obj;
  char const* query_data;
  Py_ssize_t query_size;
  // CtrlP-provided options.
  int limit_int = -1;
  char const* mmode_data = nullptr;
  Py_ssize_t mmode_size = 0;
  int is_path = 0;
  char const* crfile_data = nullptr;
  Py_ssize_t crfile_size = 0;
  // cpsm-specific options.
  char const* highlight_mode_data = nullptr;
  Py_ssize_t highlight_mode_size = 0;
  int match_crfile = 0;
  int max_threads_int = 0;
  char const* query_inverting_delimiter_data = nullptr;
  Py_ssize_t query_inverting_delimiter_size = 0;
  char const* regex_line_prefix_data = nullptr;
  Py_ssize_t regex_line_prefix_size = 0;
  int unicode = 0;
  if (!PyArg_ParseTupleAndKeywords(
          args, kwargs, "Os#|iz#iz#z#iiz#z#i", const_cast<char**>(kwlist),
          &items_obj, &query_data, &query_size, &limit_int, &mmode_data,
          &mmode_size, &is_path, &crfile_data, &crfile_size,
          &highlight_mode_data, &highlight_mode_size, &match_crfile,
          &max_threads_int, &query_inverting_delimiter_data,
          &query_inverting_delimiter_size, &regex_line_prefix_data,
          &regex_line_prefix_size, &unicode)) {
    return nullptr;
  }

  try {
    std::string query(query_data, query_size);
    boost::string_ref query_inverting_delimiter(query_inverting_delimiter_data,
                                                query_inverting_delimiter_size);
    if (!query_inverting_delimiter.empty()) {
      if (query_inverting_delimiter.size() > 1) {
        throw cpsm::Error(
            "query inverting delimiter must be a single character");
      }
      query = cpsm::str_join(boost::adaptors::reverse(cpsm::str_split(
                                 query, query_inverting_delimiter[0])),
                             "");
    }

    auto const mopts =
        cpsm::Options()
            .set_crfile(boost::string_ref(crfile_data, crfile_size))
            .set_limit((limit_int >= 0) ? std::size_t(limit_int) : 0)
            .set_match_crfile(match_crfile)
            .set_nr_threads(
                 get_nr_threads((max_threads_int >= 0)
                                    ? static_cast<unsigned int>(max_threads_int)
                                    : 0))
            .set_path(is_path)
            .set_unicode(unicode)
            .set_want_match_info(true);
    boost::string_ref const highlight_mode(highlight_mode_data,
                                           highlight_mode_size);

    PyObjPtr output_tuple(PyTuple_New(2));
    if (!output_tuple) {
      return nullptr;
    }
    PyObjPtr matches_list(PyList_New(0));
    if (!matches_list) {
      return nullptr;
    }
    std::vector<std::string> highlight_regexes;
    for_each_pyctrlp_match(
        query, mopts,
        cpsm::parse_ctrlp_match_mode(boost::string_ref(mmode_data, mmode_size)),
        items_obj,
        [&](boost::string_ref const item, boost::string_ref const match_key,
            PyObject* const obj, cpsm::MatchInfo* const info) {
          if (PyList_Append(matches_list.get(), obj) < 0) {
            throw cpsm::Error("match appending failed");
          }
          auto match_positions = info->match_positions();
          // Adjust match positions to account for substringing.
          std::size_t const delta = match_key.data() - item.data();
          for (auto& pos : match_positions) {
            pos += delta;
          }
          cpsm::get_highlight_regexes(
              highlight_mode, item, match_positions, highlight_regexes,
              boost::string_ref(regex_line_prefix_data,
                                regex_line_prefix_size));
        });
    if (PyTuple_SetItem(output_tuple.get(), 0, matches_list.release())) {
      return nullptr;
    }
    PyObjPtr regexes_list(PyList_New(0));
    if (!regexes_list) {
      return nullptr;
    }
    for (auto const& regex : highlight_regexes) {
      PyObjPtr regex_str(
          PyVimString_FromStringAndSize(regex.data(), regex.size()));
      if (!regex_str) {
        return nullptr;
      }
      if (PyList_Append(regexes_list.get(), regex_str.get()) < 0) {
        return nullptr;
      }
    }
    if (PyTuple_SetItem(output_tuple.get(), 1, regexes_list.release())) {
      return nullptr;
    }
    return output_tuple.release();
  } catch (std::exception const& ex) {
    PyErr_SetString(PyExc_RuntimeError, ex.what());
    return nullptr;
  }
}